

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# stats.cpp
# Opt level: O1

void __thiscall
pbrt::StatsAccumulator::ReportFloatDistribution
          (StatsAccumulator *this,char *name,double sum,int64_t count,double min,double max)

{
  undefined1 auVar1 [16];
  Stats *pSVar2;
  bool bVar3;
  ulong uVar4;
  undefined1 auVar5 [16];
  undefined1 auVar6 [16];
  mapped_type *pmVar7;
  undefined1 auVar8 [16];
  undefined8 in_XMM1_Qb;
  undefined8 in_XMM2_Qb;
  undefined1 auVar9 [16];
  allocator<char> local_61;
  double local_60;
  key_type local_58;
  double local_38;
  undefined8 uStack_30;
  double local_28;
  undefined8 uStack_20;
  
  pSVar2 = this->stats;
  local_60 = sum;
  local_38 = min;
  uStack_30 = in_XMM1_Qb;
  local_28 = max;
  uStack_20 = in_XMM2_Qb;
  std::__cxx11::string::string<std::allocator<char>>((string *)&local_58,name,&local_61);
  pmVar7 = std::
           map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_pbrt::StatsAccumulator::Stats::Distribution<double>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_pbrt::StatsAccumulator::Stats::Distribution<double>_>_>_>
           ::operator[](&pSVar2->floatDistributions,&local_58);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_58._M_dataplus._M_p != &local_58.field_2) {
    operator_delete(local_58._M_dataplus._M_p,local_58.field_2._M_allocated_capacity + 1);
  }
  pmVar7->sum = local_60 + pmVar7->sum;
  pmVar7->count = pmVar7->count + count;
  auVar1._0_8_ = pmVar7->min;
  auVar1._8_8_ = pmVar7->max;
  auVar6._8_8_ = uStack_20;
  auVar6._0_8_ = local_28;
  auVar8 = vunpcklpd_avx(auVar1,auVar6);
  auVar5._8_8_ = uStack_30;
  auVar5._0_8_ = local_38;
  auVar9._8_8_ = auVar1._8_8_;
  auVar9._0_8_ = local_38;
  uVar4 = vcmppd_avx512vl(auVar9,auVar8,1);
  auVar8 = vunpcklpd_avx512vl(auVar5,auVar6);
  bVar3 = (bool)((byte)(uVar4 & 3) & 1);
  uVar4 = (uVar4 & 3) >> 1;
  pmVar7->min = (double)((ulong)bVar3 * auVar8._0_8_ | (ulong)!bVar3 * auVar1._0_8_);
  pmVar7->max = (double)(uVar4 * auVar8._8_8_ | (ulong)!SUB81(uVar4,0) * auVar1._8_8_);
  return;
}

Assistant:

void StatsAccumulator::ReportFloatDistribution(const char *name, double sum,
                                               int64_t count, double min, double max) {
    Stats::Distribution<double> &distrib = stats->floatDistributions[name];
    distrib.sum += sum;
    distrib.count += count;
    distrib.min = std::min(distrib.min, min);
    distrib.max = std::max(distrib.max, max);
}